

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minAbsNzo(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool unscaled)

{
  type_conflict5 tVar1;
  double *pdVar2;
  undefined7 in_register_00000011;
  int i;
  uint uVar3;
  int i_1;
  long lVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  m;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_60;
  
  pdVar2 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,*pdVar2,(type *)0x0);
  if (((int)CONCAT71(in_register_00000011,unscaled) == 0) || (this->_isScaled != true)) {
    for (lVar4 = 0;
        lVar4 < (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum; lVar4 = lVar4 + 1) {
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::minAbs(&local_60,
               (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)((this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem +
                  (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[lVar4].idx));
      tVar1 = boost::multiprecision::operator<(&local_60,__return_storage_ptr__);
      if (tVar1) {
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             local_60.m_backend.data._M_elems._32_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             local_60.m_backend.data._M_elems._16_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             local_60.m_backend.data._M_elems._24_8_;
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             local_60.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             local_60.m_backend.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = local_60.m_backend.exp;
        (__return_storage_ptr__->m_backend).neg = local_60.m_backend.neg;
        (__return_storage_ptr__->m_backend).fpclass = local_60.m_backend.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = local_60.m_backend.prec_elem;
      }
    }
  }
  else {
    for (uVar3 = 0;
        (int)uVar3 <
        (this->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum; uVar3 = uVar3 + 1) {
      (*this->lp_scaler->_vptr_SPxScaler[0x13])(&local_60,this->lp_scaler,this,(ulong)uVar3);
      tVar1 = boost::multiprecision::operator<(&local_60,__return_storage_ptr__);
      if (tVar1) {
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             local_60.m_backend.data._M_elems._32_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             local_60.m_backend.data._M_elems._16_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             local_60.m_backend.data._M_elems._24_8_;
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             local_60.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             local_60.m_backend.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = local_60.m_backend.exp;
        (__return_storage_ptr__->m_backend).neg = local_60.m_backend.neg;
        (__return_storage_ptr__->m_backend).fpclass = local_60.m_backend.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = local_60.m_backend.prec_elem;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline
R SPxLPBase<R>::minAbsNzo(bool unscaled) const
{
   R mini = R(infinity);

   if(unscaled && _isScaled)
   {
      assert(lp_scaler != nullptr);

      for(int i = 0; i < nCols(); ++i)
      {
         R m = lp_scaler->getColMinAbsUnscaled(*this, i);

         if(m < mini)
            mini = m;
      }
   }
   else
   {
      for(int i = 0; i < nCols(); ++i)
      {
         R m = colVector(i).minAbs();

         if(m < mini)
            mini = m;
      }
   }

   assert(mini >= 0.0);

   return mini;
}